

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O0

char * vk::wsi::getName(Type wsiType)

{
  char **ppcVar1;
  Type wsiType_local;
  
  ppcVar1 = de::getSizedArrayElement<6,6,char_const*>(&getName::s_names,wsiType);
  return *ppcVar1;
}

Assistant:

const char* getName (Type wsiType)
{
	static const char* const s_names[] =
	{
		"xlib",
		"xcb",
		"wayland",
		"mir",
		"android",
		"win32",
	};
	return de::getSizedArrayElement<TYPE_LAST>(s_names, wsiType);
}